

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

string * __thiscall
Catch::TestSpec::Filter::name_abi_cxx11_(string *__return_storage_ptr__,Filter *this)

{
  pointer psVar1;
  shared_ptr<Catch::TestSpec::Pattern> *p;
  pointer psVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (this->m_patterns).
           super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->m_patterns).
                super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,
               (ulong)(((psVar2->
                        super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->m_name)._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestSpec::Filter::name() const {
        std::string name;
        for( auto const& p : m_patterns )
            name += p->name();
        return name;
    }